

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_BasicPartialInequivalencyTest_Test::
TestBody(MessageDifferencerTest_BasicPartialInequivalencyTest_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  TestAllTypes msg1;
  TestAllTypes msg2;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_880;
  AssertHelper local_878;
  internal local_870 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_868;
  string local_860;
  MessageDifferencer local_840;
  TestAllTypes local_690;
  TestAllTypes local_350;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_690,(Arena *)0x0);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_350,(Arena *)0x0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_690);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_350);
  local_690.field_0._impl_.optional_int32_ = -1;
  local_690.field_0._impl_._has_bits_.has_bits_[0]._1_1_ =
       local_690.field_0._impl_._has_bits_.has_bits_[0]._1_1_ | 0x10;
  util::MessageDifferencer::MessageDifferencer(&local_840);
  util::MessageDifferencer::set_message_field_comparison(&local_840,EQUIVALENT);
  util::MessageDifferencer::set_scope(&local_840,PARTIAL);
  bVar1 = util::MessageDifferencer::Compare
                    (&local_840,&local_690.super_Message,&local_350.super_Message);
  local_870[0] = (internal)!bVar1;
  local_868 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_880);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_860,local_870,(AssertionResult *)0x126d6fd,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x348,local_860._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_878,(Message *)&local_880);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    }
    if (local_880._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_880._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_868 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_868,local_868);
  }
  util::MessageDifferencer::~MessageDifferencer(&local_840);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_350);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_690);
  return;
}

Assistant:

TEST(MessageDifferencerTest, BasicPartialInequivalencyTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  msg1.set_optional_int32(-1);

  // Compare
  util::MessageDifferencer differencer;
  differencer.set_message_field_comparison(
      util::MessageDifferencer::EQUIVALENT);
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
}